

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * x_convolve_8tap_avx2(__m256i data,__m256i *coeffs,__m256i *filt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *palVar5;
  undefined1 (*in_RSI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m256i ss [4];
  
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  vpshufb_avx2(auVar4,*in_RSI);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  vpshufb_avx2(auVar3,in_RSI[1]);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  vpshufb_avx2(auVar2,in_RSI[2]);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  vpshufb_avx2(auVar1,in_RSI[3]);
  palVar5 = convolve_8tap_avx2(*(__m256i **)(in_RSI[3] + 0x10),*(__m256i **)(in_RSI[3] + 8));
  return palVar5;
}

Assistant:

static inline __m256i x_convolve_8tap_avx2(const __m256i data,
                                           const __m256i coeffs[4],
                                           const __m256i filt[4]) {
  __m256i ss[4];

  ss[0] = _mm256_shuffle_epi8(data, filt[0]);
  ss[1] = _mm256_shuffle_epi8(data, filt[1]);
  ss[2] = _mm256_shuffle_epi8(data, filt[2]);
  ss[3] = _mm256_shuffle_epi8(data, filt[3]);

  return convolve_8tap_avx2(ss, coeffs);
}